

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

void __thiscall FIX::SocketServer::SocketServer(SocketServer *this,int timeout)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_socketToInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SocketMonitor::SocketMonitor(&this->m_monitor,timeout);
  return;
}

Assistant:

SocketServer::SocketServer( int timeout )
: m_monitor( timeout ) {}